

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O3

void __thiscall Kernel::UnstableVarIt::UnstableVarIt(UnstableVarIt *this,Term *t)

{
  Stack<bool> *this_00;
  Stack<Kernel::TermList> *this_01;
  size_t sVar1;
  uint64_t uVar2;
  bool *pbVar3;
  TermList *pTVar4;
  bool *pbVar5;
  TermList *pTVar6;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__UnstableVarIt_00b3d980;
  (this->_next)._content = 2;
  (this->_stable)._capacity = 8;
  pbVar3 = (bool *)Lib::FixedSizeAllocator<16UL>::alloc
                             ((FixedSizeAllocator<16UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  this_00 = &this->_stable;
  (this->_stable)._stack = pbVar3;
  (this->_stable)._cursor = pbVar3;
  (this->_stable)._end = pbVar3 + (this->_stable)._capacity;
  (this->_stack)._capacity = 8;
  pTVar4 = (TermList *)
           Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  this_01 = &this->_stack;
  (this->_stack)._stack = pTVar4;
  sVar1 = (this->_stack)._capacity;
  (this->_stack)._cursor = pTVar4;
  pTVar6 = pTVar4 + sVar1;
  (this->_stack)._end = pTVar6;
  (this->_next)._content = 2;
  if ((t->_args[0]._content & 0x10) == 0) {
    pbVar3 = (this->_stable)._cursor;
    if (pbVar3 == (this->_stable)._end) {
      Lib::Stack<bool>::expand(this_00);
      pbVar3 = (this->_stable)._cursor;
      pTVar4 = (this->_stack)._cursor;
      pTVar6 = (this->_stack)._end;
    }
    *pbVar3 = true;
    (this->_stable)._cursor = pbVar3 + 1;
    if (pTVar4 == pTVar6) {
      Lib::Stack<Kernel::TermList>::expand(this_01);
      pTVar4 = (this->_stack)._cursor;
    }
    pTVar4->_content = (uint64_t)t;
    (this->_stack)._cursor = pTVar4 + 1;
  }
  else {
    uVar2 = t->_args[*(uint *)&t->field_0xc & 0xfffffff]._content;
    if (sVar1 == 0) {
      Lib::Stack<Kernel::TermList>::expand(this_01);
      pTVar4 = (this->_stack)._cursor;
      pTVar6 = (this->_stack)._end;
    }
    pTVar4->_content = uVar2;
    pTVar4 = pTVar4 + 1;
    (this->_stack)._cursor = pTVar4;
    uVar2 = t->_args[(ulong)(*(uint *)&t->field_0xc & 0xfffffff) - 1]._content;
    if (pTVar4 == pTVar6) {
      Lib::Stack<Kernel::TermList>::expand(this_01);
      pTVar4 = (this->_stack)._cursor;
    }
    pTVar4->_content = uVar2;
    (this->_stack)._cursor = pTVar4 + 1;
    pbVar5 = (this->_stable)._cursor;
    pbVar3 = (this->_stable)._end;
    if (pbVar5 == pbVar3) {
      Lib::Stack<bool>::expand(this_00);
      pbVar5 = (this->_stable)._cursor;
      pbVar3 = (this->_stable)._end;
    }
    *pbVar5 = true;
    pbVar5 = pbVar5 + 1;
    (this->_stable)._cursor = pbVar5;
    if (pbVar5 == pbVar3) {
      Lib::Stack<bool>::expand(this_00);
      pbVar5 = (this->_stable)._cursor;
    }
    *pbVar5 = true;
    (this->_stable)._cursor = pbVar5 + 1;
  }
  return;
}

Assistant:

UnstableVarIt(Term* t) : _stable(8), _stack(8)
  {
    _next = TermList::empty();
    if(t->isLiteral()){
      _stack.push(*t->nthArgument(0));
      _stack.push(*t->nthArgument(1));
      _stable.push(true);
      _stable.push(true);   
      return;      
    }
    _stable.push(true);
    _stack.push(TermList(t)); 
  }